

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewKalmanFilter.c
# Opt level: O0

double * kalman_GPS_INS_pv(double *Dpv,double Ve,double Vn,double Vu,double L,double h,
                          double *mahonyR,double *Fn,double tao,double Rm,double Rn)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double *XX;
  double *W;
  double *Z;
  double *K;
  double *Y;
  double *P;
  double *B;
  double *A;
  double *eye15;
  double matrixH [6] [15];
  double *H;
  double matrixG [15] [6];
  double *G;
  double matrixF [15] [15];
  double *F;
  double ta;
  double tg;
  double Rmh2;
  double Rnh2;
  double secL2;
  double fu;
  double fn;
  double fe;
  double wie;
  double PP0k [15];
  double local_c8;
  double Rk [6];
  double Q_diag [6];
  double Rn_local;
  double Rm_local;
  double tao_local;
  double *Fn_local;
  double *mahonyR_local;
  double h_local;
  double L_local;
  double Vu_local;
  double Vn_local;
  double Ve_local;
  double *Dpv_local;
  
  Q_wa = pow(G0 * 5e-05,2.0);
  Rk[5] = Q_wg;
  local_c8 = Rlamt;
  Rk[0] = Rl;
  Rk[1] = Rh;
  Rk[2] = Rvx;
  Rk[3] = Rvy;
  Rk[4] = Rvz;
  wie = 3.0778701138811943e-06;
  PP0k[0] = 3.0778701138811943e-06;
  PP0k[1] = 3.0778701138811943e-06;
  PP0k[2] = 0.0001;
  PP0k[3] = 0.0001;
  PP0k[4] = 0.0001;
  PP0k[5] = 0.0;
  PP0k[6] = 0.0;
  PP0k[7] = 0.0;
  PP0k[8] = 2.3748997792293167e-13;
  PP0k[9] = 2.3748997792293167e-13;
  PP0k[10] = 2.3748997792293167e-13;
  PP0k[0xb] = G0 * 0.0001 * G0 * 0.0001;
  PP0k[0xc] = G0 * 0.0001 * G0 * 0.0001;
  PP0k[0xd] = G0 * 0.0001 * G0 * 0.0001;
  Q = MatDiag(Rk + 5,6);
  R = MatDiag(&local_c8,6);
  if (PP == (double *)0x0) {
    PP = MatDiag(&wie,0xf);
  }
  if (X == (double *)0x0) {
    X = (double *)malloc(0x78);
    memset(X,0,0x78);
  }
  dVar14 = *Fn;
  dVar15 = Fn[1];
  dVar13 = Fn[2];
  dVar7 = sin(L);
  dVar8 = sin(L);
  dVar2 = Ta[0];
  dVar1 = Tg[0];
  dVar7 = 1.0 / (dVar7 * dVar8);
  dVar8 = (Rn + h) * (Rn + h);
  dVar9 = (Rm + h) * (Rm + h);
  malloc(0x708);
  G = (double *)0x0;
  dVar10 = sin(L);
  dVar11 = tan(L);
  matrixF[0][0] = dVar10 * -7.292e-05 + -((Ve * dVar11) / (Rn + h));
  matrixF[0][1] = Vn / (Rm + h);
  matrixF[0][2] = 0.0;
  matrixF[0][3] = 1.0 / (Rn + h);
  matrixF[0][4] = 0.0;
  dVar10 = sin(L);
  matrixF[0][5] = dVar10 * -7.292e-05;
  matrixF[0][6] = 0.0;
  matrixF[0][7] = -Ve / dVar8;
  matrixF[0][8] = *mahonyR;
  matrixF[0][9] = mahonyR[3];
  matrixF[0][10] = mahonyR[6];
  matrixF[0][0xb] = 0.0;
  matrixF[0][0xc] = 0.0;
  matrixF[0][0xd] = 0.0;
  dVar10 = sin(L);
  dVar11 = tan(L);
  matrixF[0][0xe] = dVar10 * 7.292e-05 + (Ve * dVar11) / (Rn + h);
  matrixF[1][0] = 0.0;
  dVar10 = cos(L);
  matrixF[1][1] = dVar10 * 7.292e-05 + Ve / (Rn + h);
  matrixF[1][2] = -1.0 / (Rm + h);
  matrixF[1][3] = 0.0;
  matrixF[1][4] = 0.0;
  matrixF[1][5] = 0.0;
  matrixF[1][6] = 0.0;
  matrixF[1][7] = Vn / dVar9;
  matrixF[1][8] = mahonyR[1];
  matrixF[1][9] = mahonyR[4];
  matrixF[1][10] = mahonyR[7];
  matrixF[1][0xb] = 0.0;
  matrixF[1][0xc] = 0.0;
  matrixF[1][0xd] = 0.0;
  matrixF[1][0xe] = -Vn / (Rm + h);
  dVar10 = cos(L);
  matrixF[2][0] = dVar10 * -7.292e-05 + -(Ve / (Rn + h));
  matrixF[2][1] = 0.0;
  matrixF[2][2] = 0.0;
  dVar10 = tan(L);
  matrixF[2][3] = -dVar10 / (Rn + h);
  matrixF[2][4] = 0.0;
  dVar10 = cos(L);
  matrixF[2][5] = dVar10 * -7.292e-05 + -((Ve * dVar7) / (Rn + h));
  matrixF[2][6] = 0.0;
  dVar10 = tan(L);
  matrixF[2][7] = (Ve * dVar10) / dVar8;
  matrixF[2][8] = mahonyR[2];
  matrixF[2][9] = mahonyR[5];
  matrixF[2][10] = mahonyR[8];
  matrixF[2][0xb] = 0.0;
  matrixF[2][0xc] = 0.0;
  matrixF[2][0xd] = 0.0;
  matrixF[2][0xe] = 0.0;
  matrixF[3][0] = -dVar13;
  matrixF[3][2] = Vu / (Rm + h);
  matrixF[3][1] = dVar14;
  dVar10 = sin(L);
  dVar11 = tan(L);
  dVar12 = tan(L);
  matrixF[3][3] = (dVar10 * -0.00014584 + -((Ve * dVar11) / (Rn + h))) - (Ve * dVar12) / (Rn + h);
  matrixF[3][4] = Vn / (Rm + h);
  dVar10 = cos(L);
  matrixF[3][5] = dVar10 * -0.00014584 * Ve + -((Ve * Ve * dVar7) / (Rn + h));
  matrixF[3][6] = 0.0;
  dVar10 = tan(L);
  matrixF[3][7] = (Ve * Ve * dVar10) / dVar8 - (Vn * Vu) / dVar9;
  matrixF[3][8] = 0.0;
  matrixF[3][9] = 0.0;
  matrixF[3][10] = 0.0;
  matrixF[3][0xb] = *mahonyR;
  matrixF[3][0xc] = mahonyR[3];
  matrixF[3][0xd] = mahonyR[6];
  matrixF[4][0] = 0.0;
  matrixF[4][1] = -dVar15;
  matrixF[3][0xe] = dVar13;
  dVar13 = sin(L);
  dVar10 = tan(L);
  matrixF[4][2] = dVar13 * 0.00014584 + (Ve * dVar10) / (Rn + h);
  dVar13 = tan(L);
  matrixF[4][3] = (Vn * dVar13 + Vu) / (Rn + h);
  dVar13 = cos(L);
  matrixF[4][4] = dVar13 * 0.00014584 + Ve / (Rn + h);
  dVar13 = cos(L);
  dVar10 = sin(L);
  matrixF[4][5] = (dVar13 * 0.00014584 + (Ve * dVar7) / (Rn + h)) * Vn + -(Vu * 0.00014584 * dVar10)
  ;
  matrixF[4][6] = 0.0;
  dVar13 = tan(L);
  matrixF[4][7] = (Ve * Vn * dVar13 + -(Ve * Vu)) / dVar8;
  matrixF[4][8] = 0.0;
  matrixF[4][9] = 0.0;
  matrixF[4][10] = 0.0;
  matrixF[4][0xb] = mahonyR[1];
  matrixF[4][0xc] = mahonyR[4];
  matrixF[4][0xd] = mahonyR[7];
  matrixF[4][0xe] = -dVar14;
  matrixF[5][1] = 0.0;
  matrixF[5][2] = -Vn / (Rm + h);
  matrixF[5][0] = dVar15;
  dVar14 = cos(L);
  matrixF[5][3] = dVar14 * -0.00014584 + -((Ve * 2.0) / (Rn + h));
  matrixF[5][4] = 0.0;
  dVar14 = sin(L);
  matrixF[5][5] = Ve * 2.0 * 7.292e-05 * dVar14;
  matrixF[5][6] = 0.0;
  matrixF[5][7] = (Ve * Ve) / dVar8 + (Vn * Vn) / dVar9;
  matrixF[5][8] = 0.0;
  matrixF[5][9] = 0.0;
  matrixF[5][10] = 0.0;
  matrixF[5][0xb] = mahonyR[2];
  matrixF[5][0xc] = mahonyR[5];
  matrixF[5][0xd] = mahonyR[8];
  memset(matrixF[5] + 0xe,0,0x78);
  matrixF[6][2] = 1.0 / (Rm + h);
  matrixF[6][7] = -Vn / dVar9;
  memset(matrixF[6] + 0xe,0,0x78);
  dVar14 = cos(L);
  matrixF[7][3] = 1.0 / ((Rn + h) * dVar14);
  dVar14 = tan(L);
  dVar15 = cos(L);
  matrixF[7][5] = (Ve * dVar14) / ((Rn + h) * dVar15);
  dVar14 = cos(L);
  matrixF[7][7] = -Ve / (dVar14 * dVar8);
  memset(matrixF[7] + 0xe,0,0x78);
  memcpy(matrixF[7] + 0xe,&DAT_0010c370,0x78);
  memset(matrixF[8] + 0xe,0,0x78);
  matrixF[9][8] = -1.0 / dVar1;
  memset(matrixF[9] + 0xe,0,0x78);
  matrixF[10][9] = -1.0 / dVar1;
  memset(matrixF[10] + 0xe,0,0x78);
  matrixF[0xb][10] = -1.0 / dVar1;
  memset(matrixF[0xb] + 0xe,0,0x78);
  matrixF[0xc][0xb] = -1.0 / dVar2;
  memset(matrixF[0xc] + 0xe,0,0x78);
  matrixF[0xd][0xc] = -1.0 / dVar2;
  memset(matrixF[0xd] + 0xe,0,0x78);
  matrixF[0xe][0xd] = -1.0 / dVar2;
  malloc(0x2d0);
  memset(&H,0,0x2d0);
  H = (double *)*mahonyR;
  matrixG[0][0] = mahonyR[3];
  matrixG[0][1] = mahonyR[6];
  matrixG[0][5] = mahonyR[1];
  matrixG[1][0] = mahonyR[4];
  matrixG[1][1] = mahonyR[7];
  matrixG[1][5] = mahonyR[2];
  matrixG[2][0] = mahonyR[5];
  matrixG[2][1] = mahonyR[8];
  matrixG[3][2] = *mahonyR;
  matrixG[3][3] = mahonyR[3];
  matrixG[3][4] = mahonyR[6];
  matrixG[4][2] = mahonyR[1];
  matrixG[4][3] = mahonyR[4];
  matrixG[4][4] = mahonyR[7];
  matrixG[5][2] = mahonyR[2];
  matrixG[5][3] = mahonyR[5];
  matrixG[5][4] = mahonyR[8];
  memcpy(matrixG[5] + 5,&DAT_0010c3e8,0x30);
  memcpy(matrixG[6] + 5,&DAT_0010c418,0x30);
  memcpy(matrixG[7] + 5,&DAT_0010c448,0x30);
  memcpy(matrixG[8] + 5,&DAT_0010c478,0x30);
  memcpy(matrixG[9] + 5,&DAT_0010c4a8,0x30);
  memcpy(matrixG[10] + 5,&DAT_0010c4d8,0x30);
  memcpy(matrixG[0xb] + 5,&DAT_0010c508,0x30);
  memcpy(matrixG[0xc] + 5,&DAT_0010c538,0x30);
  memcpy(matrixG[0xd] + 5,&DAT_0010c568,0x30);
  malloc(0x2d0);
  memset(&eye15,0,0x2d0);
  matrixH[0][5] = Rm + h;
  dVar14 = cos(L);
  matrixH[1][6] = (Rn + h) * dVar14;
  memcpy(matrixH[1] + 0xe,&DAT_0010c598,0x78);
  memcpy(matrixH[2] + 0xe,&DAT_0010c610,0x78);
  memcpy(matrixH[3] + 0xe,&DAT_0010c688,0x78);
  memcpy(matrixH[4] + 0xe,&DAT_0010c700,0x78);
  pdVar3 = MatEye(0xf);
  pdVar4 = MatMulk((double *)&G,0xf,0xf,tao);
  pdVar4 = MatAdd(pdVar3,pdVar4,0xf,0xf);
  pdVar5 = MatMulk((double *)&H,0xf,6,tao);
  X = MatMul(pdVar4,0xf,0xf,X,0xf,1);
  pdVar6 = MatMul(pdVar4,0xf,0xf,PP,0xf,0xf);
  pdVar4 = MatT(pdVar4,0xf,0xf);
  pdVar4 = MatMul(pdVar6,0xf,0xf,pdVar4,0xf,0xf);
  pdVar6 = MatMul(pdVar5,0xf,6,Q,6,6);
  pdVar5 = MatT(pdVar5,0xf,6);
  pdVar5 = MatMul(pdVar6,0xf,6,pdVar5,6,0xf);
  pdVar4 = MatAdd(pdVar4,pdVar5,0xf,0xf);
  pdVar5 = MatMul((double *)&eye15,6,0xf,pdVar4,0xf,0xf);
  pdVar6 = MatT((double *)&eye15,6,0xf);
  pdVar5 = MatMul(pdVar5,6,0xf,pdVar6,0xf,6);
  pdVar5 = MatAdd(pdVar5,R,6,6);
  pdVar6 = MatT((double *)&eye15,6,0xf);
  pdVar6 = MatMul(pdVar4,0xf,0xf,pdVar6,0xf,6);
  pdVar5 = MatInv(pdVar5,6,6);
  pdVar5 = MatMul(pdVar6,0xf,6,pdVar5,6,6);
  pdVar6 = MatMul(pdVar5,0xf,6,(double *)&eye15,6,0xf);
  pdVar3 = MatSub(pdVar3,pdVar6,0xf,0xf);
  PP = MatMul(pdVar3,0xf,0xf,pdVar4,0xf,0xf);
  pdVar3 = MatMul((double *)&eye15,6,0xf,X,0xf,1);
  pdVar4 = MatSub(Dpv,pdVar3,6,1);
  pdVar3 = X;
  pdVar4 = MatMul(pdVar5,0xf,6,pdVar4,6,1);
  pdVar3 = MatAdd(pdVar3,pdVar4,0xf,1);
  return pdVar3;
}

Assistant:

double* kalman_GPS_INS_pv(double* Dpv,double Ve,double Vn,double Vu,double L,double h,double* mahonyR,double* Fn,double tao,double Rm,double Rn) {
//    FILE *f_w = fopen("w.csv","a"),*f_z = fopen("z.csv","a");
    Q_wa = pow(((0.5e-4)*G0),2);//加速度计的随机偏差为0.5e-4*g
    double Q_diag[6] = {Q_wg, Q_wg, Q_wg, Q_wa, Q_wa, Q_wa};
    double Rk[6] = {Rlamt, Rl, Rh, Rvx, Rvy, Rvz};
    double PP0k[15] = {(0.1/(57))*(0.1/(57)), (0.1/(57))*(0.1/(57)), (0.1/(57))*(0.1/(57)),
                       0.01*0.01, 0.01*0.01, 0.01*0.01,0, 0, 0,
                       (0.1/(57*3600))*(0.1/(57*3600)), (0.1/(57*3600))*(0.1/(57*3600)), (0.1/(57*3600))*(0.1/(57*3600)),
                       ((1e-4)*G0)*((1e-4)*G0), ((1e-4)*G0)*((1e-4)*G0), ((1e-4)*G0)*((1e-4)*G0)};
    double wie = 7.292e-5;
    Q = MatDiag(Q_diag,6);
    R = MatDiag(Rk,6);
    if(PP == NULL)
        PP = MatDiag(PP0k,15);
    if(X == NULL){
        X = (double*)malloc(sizeof(double) * 15);
        memset(X,0,15 * sizeof(double));
    }
    
    double fe = Fn[0];
    double fn = Fn[1];
    double fu = Fn[2];
    //连续系统状态转换阵 F 的时间更新
    double secL2 = (1 / (sin(L) * sin(L)));
    double Rnh2 = (Rn + h) * (Rn + h);
    double Rmh2 = ((Rm + h) * (Rm + h));
    double tg = Tg[0];
    double ta = Ta[0];

    double* F = (double*)malloc(sizeof(double) * 225);
    double matrixF[15][15] = {
            {0, -wie * sin(L) - Ve * tan(L) / (Rn + h), Vn / (Rm + h), 0, 1 / (Rn + h), 0, -wie * sin(L), 0, -Ve / Rnh2, mahonyR[0], mahonyR[3], mahonyR[6], 0, 0, 0},
            {wie * sin(L) + Ve * tan(L) / (Rn + h), 0, wie * cos(L) + Ve / (Rn + h), -1 / (Rm + h), 0, 0, 0, 0, Vn / Rmh2, mahonyR[1], mahonyR[4], mahonyR[7], 0, 0, 0},
            {-Vn / (Rm + h), -wie * cos(L) - Ve / (Rn + h), 0, 0, -tan(L) / (Rn + h), 0, -wie * cos(L) - Ve * secL2 / (Rn + h), 0, Ve * tan(L) / Rnh2, mahonyR[2], mahonyR[5], mahonyR[8], 0, 0, 0},
            {0, -fu, fe, Vu / (Rm + h), -2 * wie * sin(L) - Ve * tan(L) / (Rn + h) - Ve * tan(L) / (Rn + h), Vn / (Rm + h), -2 * wie * cos(L) * Ve - Ve * Ve * secL2 / (Rn + h), 0, Ve * Ve * tan(L) / Rnh2 - Vn * Vu / Rmh2, 0, 0, 0, mahonyR[0], mahonyR[3], mahonyR[6]},
            {fu, 0, -fn, 2 * wie * sin(L) + Ve * tan(L) / (Rn + h), (Vn * tan(L) + Vu) / (Rn + h), 2 * wie * cos(L) + Ve / (Rn + h), (2 * wie * cos(L) + Ve * (secL2) / (Rn + h)) * Vn - 2 * wie * Vu * sin(L), 0, (Ve * Vn * tan(L) - Ve * Vu) / Rnh2, 0, 0, 0,mahonyR[1], mahonyR[4], mahonyR[7]},
            {-fe, fn, 0, -Vn / (Rm + h), -2 * wie * cos(L) - 2 * Ve / (Rn + h), 0, 2 * Ve * wie * sin(L), 0, Ve * Ve / Rnh2 + Vn * Vn / Rmh2, 0, 0, 0, mahonyR[2], mahonyR[5], mahonyR[8]},
            {0, 0, 0, 1 / (Rm + h), 0, 0, 0, 0, -Vn / Rmh2, 0, 0, 0, 0, 0, 0},
            {0, 0, 0, 0, 1 / ((Rn + h) * cos(L)), 0, Ve * tan(L) / ((Rn + h) * cos(L)), 0, -Ve / (cos(L) * Rnh2), 0, 0, 0, 0, 0, 0},
            {0, 0, 0, 0, 0, -1, 0, 0, 0, 0, 0, 0, 0, 0, 0},
            {0, 0, 0, 0, 0, 0, 0, 0, 0, -1 / tg, 0, 0, 0, 0, 0},
            {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, -1 / tg, 0, 0, 0, 0},
            {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, -1 / tg, 0, 0, 0},
            {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, -1 / ta, 0, 0},
            {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, -1 / ta, 0},
            {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, -1 / ta}
    };
    F = (double*)matrixF;//15*15

    double* G = (double*)malloc(sizeof(double) * 90);

    double matrixG[15][6] = {
            {mahonyR[0], mahonyR[3], mahonyR[6],0,0,0},
            {mahonyR[1], mahonyR[4], mahonyR[7],0,0,0},
            {mahonyR[2], mahonyR[5], mahonyR[8],0,0,0},
            {0, 0, 0, mahonyR[0], mahonyR[3], mahonyR[6]},
            {0, 0, 0, mahonyR[1], mahonyR[4], mahonyR[7]},
            {0, 0, 0, mahonyR[2], mahonyR[5], mahonyR[8]},
            {0,0,0,0,0,0},
            {0,0,0,0,0,0},
            {0,0,0,0,0,0},
            {0,0,0,0,0,0},
            {0,0,0,0,0,0},
            {0,0,0,0,0,0},
            {0,0,0,0,0,0},
            {0,0,0,0,0,0},
            {0,0,0,0,0,0}
    };
    G = (double*)matrixG;//15*6

    double* H = (double*)malloc(sizeof(double) * 90);
    double matrixH[6][15] = {
            {0, 0 , 0 , 0 , 0 , 0 , Rm+h , 0,0,0,0,0,0,0,0},
            {0 , 0 , 0 , 0 , 0 , 0 , 0 , (Rn+h)*cos(L) , 0 , 0 , 0 , 0 , 0 , 0 , 0},
            {0 , 0 , 0 , 0 , 0 , 0 , 0 , 0 , 1 , 0 , 0 , 0 , 0 , 0 , 0},
            {0 , 0 , 0 , 1 , 0 , 0 , 0 , 0 , 0 , 0 , 0 , 0 , 0 , 0 , 0},
            {0 , 0 , 0 , 0 , 1 , 0 , 0 , 0 , 0 , 0 , 0 , 0 , 0 , 0 , 0},
            {0 , 0 , 0 , 0 , 0 , 1 , 0 , 0 , 0 , 0 , 0 , 0 , 0 , 0 , 0},
    };
    H = (double*)matrixH;//6*15

    //连续系统离散化
    double* eye15 = MatEye(15);
    double* A = MatAdd(eye15,MatMulk(F,15,15,tao),15,15);
    double* B = MatMulk(G,15,6,tao);

    //卡尔曼滤波开始
   // printf("Now Here is the KF:\n");

    X = MatMul(A,15,15,X,15,1);
//    printf("X:\n");
//    MatShow(X,15,1);

    double* P = MatAdd(MatMul(MatMul(A,15,15,PP,15,15),15,15,MatT(A,15,15),15,15),MatMul(MatMul(B,15,6,Q,6,6),15,6,MatT(B,15,6),6,15),15,15);
//    printf("P:\n");
//    MatShow(P,15,15);

    double* Y = MatAdd(MatMul(MatMul(H,6,15,P,15,15),6,15,MatT(H,6,15),15,6),R,6,6);//6*6
//    printf("Y:\n");
//    MatShow(Y,6,6);

    double* K = MatMul(MatMul(P,15,15,MatT(H,6,15),15,6),15,6,MatInv(Y,6,6),6,6);//15*6
//    printf("K:\n");
//    MatShow(K,15,6);

    PP = MatMul(MatSub(eye15,MatMul(K,15,6,H,6,15),15,15),15,15,P,15,15);
//    printf("PP:\n");
//    MatShow(PP,15,15);

    double* Z = Dpv;
//    char z_string[1000];
//    sprintf(z_string,"%f,%f,%f,%f,%f,%f\n",Z[0],Z[1],Z[2],Z[3],Z[4],Z[5]);
//    fprintf(f_z,z_string,1000);
//    fclose(f_z);

    double* W = MatSub(Z,MatMul(H,6,15,X,15,1),6,1);
//    printf("W:\n");
//    MatShow(W,6,1);
//    char w_string[1000];
//    sprintf(w_string,"%f,%f,%f,%f,%f,%f\n",W[0],W[1],W[2],W[3],W[4],W[5]);
//    fprintf(f_w,w_string,1000);
//    fclose(f_w);

    double* XX = MatAdd(X,MatMul(K,15,6,W,6,1),15,1);
//    printf("XX:\n");
//    MatShow(XX,15,1);

    return XX;
}